

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Map(Map *this,Map *map)

{
  pointer ppEVar1;
  Entity *pEVar2;
  Blockset *pBVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  Entity *this_00;
  pointer ppEVar8;
  
  this->_id = map->_id;
  pBVar3 = map->_blockset;
  this->_layout = map->_layout;
  this->_blockset = pBVar3;
  this->_palette = map->_palette;
  uVar4 = map->_background_music;
  uVar5 = map->_unknown_param_1;
  uVar6 = map->_unknown_param_2;
  this->_room_height = map->_room_height;
  this->_background_music = uVar4;
  this->_unknown_param_1 = uVar5;
  this->_unknown_param_2 = uVar6;
  this->_base_chest_id = map->_base_chest_id;
  uVar7 = map->_climb_destination;
  this->_fall_destination = map->_fall_destination;
  this->_climb_destination = uVar7;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Rb_tree<Map_*,_std::pair<Map_*const,_Flag>,_std::_Select1st<std::pair<Map_*const,_Flag>_>,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>
  ::_Rb_tree(&(this->_variants)._M_t,&(map->_variants)._M_t);
  this->_parent_map = map->_parent_map;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::vector
            (&this->_global_entity_mask_flags,&map->_global_entity_mask_flags);
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_visited_flag)._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  (this->_visited_flag).byte = 0;
  (this->_visited_flag).bit = '\0';
  this->_map_setup_addr = 0xffffffff;
  this->_map_update_addr = 0xffffffff;
  ppEVar1 = (map->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar8 = (map->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar8 != ppEVar1; ppEVar8 = ppEVar8 + 1) {
    pEVar2 = *ppEVar8;
    this_00 = (Entity *)operator_new(0x58);
    Entity::Entity(this_00,pEVar2);
    add_entity(this,this_00);
  }
  return;
}

Assistant:

Map::Map(const Map& map) :
    _id                         (map._id),
    _layout                     (map._layout),
    _blockset                   (map._blockset),
    _palette                    (map._palette),
    _room_height                (map._room_height),
    _background_music           (map._background_music),
    _unknown_param_1            (map._unknown_param_1),
    _unknown_param_2            (map._unknown_param_2),
    _base_chest_id              (map._base_chest_id),
    _fall_destination           (map._fall_destination),
    _climb_destination          (map._climb_destination),
    _parent_map                 (map._parent_map),
    _variants                   (map._variants),
    _global_entity_mask_flags   (map._global_entity_mask_flags)
{
    for(Entity* entity : map._entities)
        this->add_entity(new Entity(*entity));
}